

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

bool scanProgramHeaders<preScanProgramHeaders(QByteArrayView,(anonymous_namespace)::ErrorMaker_const&)::__0>
               (QByteArrayView data,ErrorMaker *error,anon_class_24_3_857f553e f)

{
  bool bVar1;
  const_pointer pvVar2;
  long in_FS_OFFSET;
  Phdr *phdr_end;
  Phdr *phdr;
  Ehdr *header;
  const_pointer local_38;
  bool local_19;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = QByteArrayView::data(&local_18);
  local_38 = QByteArrayView::data(&local_18);
  local_38 = local_38 + *(long *)(pvVar2 + 0x20);
  pvVar2 = local_38 + (long)(int)(uint)*(ushort *)(pvVar2 + 0x38) * 0x38;
  do {
    if (local_38 == pvVar2) {
      local_19 = true;
LAB_008cbb7c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_19;
      }
      __stack_chk_fail();
    }
    bVar1 = preScanProgramHeaders::anon_class_24_3_857f553e::operator()
                      ((anon_class_24_3_857f553e *)data.m_data,(Phdr *)data.m_size);
    if (!bVar1) {
      local_19 = false;
      goto LAB_008cbb7c;
    }
    local_38 = local_38 + 0x38;
  } while( true );
}

Assistant:

static bool scanProgramHeaders(QByteArrayView data, const ErrorMaker &error, F f)
{
    auto header = reinterpret_cast<const T::Ehdr *>(data.data());
    Q_UNUSED(error);

    auto phdr = reinterpret_cast<const T::Phdr *>(data.data() + header->e_phoff);
    auto phdr_end = phdr + header->e_phnum;
    for ( ; phdr != phdr_end; ++phdr) {
        if (!f(phdr))
            return false;
    }
    return true;
}